

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_DotPrefixTypeCompile_Test::
~ExtensionDeclarationsTest_DotPrefixTypeCompile_Test
          (ExtensionDeclarationsTest_DotPrefixTypeCompile_Test *this)

{
  ~ExtensionDeclarationsTest_DotPrefixTypeCompile_Test
            ((ExtensionDeclarationsTest_DotPrefixTypeCompile_Test *)
             &this[-1].super_ExtensionDeclarationsTest.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, DotPrefixTypeCompile) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.bar"
                type: ".ext.test.Bar"
              }
            }
          }
        }
        message_type { name: "Bar" }
        extension { extendee: "Foo" name: "bar" number: 10 type_name: "Bar" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  EXPECT_NE(pool.BuildFile(*file_proto), nullptr);
}